

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::is_file(string *path)

{
  int iVar1;
  char *__file;
  bool local_a1;
  undefined1 local_a0 [8];
  stat st;
  string *path_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)path;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_a0);
  local_a1 = -1 < iVar1 && ((uint)st.st_nlink & 0xf000) == 0x8000;
  return local_a1;
}

Assistant:

inline bool is_file(const std::string &path) {
#ifdef _WIN32
  return _access_s(path.c_str(), 0) == 0;
#else
  struct stat st;
  return stat(path.c_str(), &st) >= 0 && S_ISREG(st.st_mode);
#endif
}